

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

void weffects(obj *obj,schar dx,schar dy,schar dz)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  xchar x;
  boolean bVar7;
  ushort uVar8;
  uint uVar9;
  trap *ptVar10;
  engr *peVar11;
  char *pcVar12;
  obj *obj_00;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  xchar cnt;
  int tmp;
  int iVar16;
  char *pcVar17;
  int x_00;
  int iVar18;
  level *plVar19;
  undefined4 in_stack_fffffffffffffe98;
  int yy;
  int xx;
  d_level *local_148;
  trap *local_140;
  char local_138 [264];
  
  sVar2 = obj->otyp;
  bVar1 = objects[sVar2].field_0x10;
  exercise(2,'\x01');
  x = u.ux;
  if ((((u.usteed == (monst *)0x0) || (dz < '\x01')) || (dy != '\0' || dx != '\0')) ||
     ((*(ushort *)&objects[sVar2].field_0x11 & 0xc) == 4)) {
LAB_00294ebf:
    uVar8 = *(ushort *)&objects[sVar2].field_0x11 >> 2 & 3;
    if (uVar8 == 1) {
      zapnodir(obj);
      return;
    }
    if (uVar8 == 2) {
      obj_zapped = '\0';
      if ((u._1052_1_ & 1) == 0) {
        if (dz == '\0') {
          uVar14 = mt_random();
          bVar4 = false;
          beam_hit((int)dx,(int)dy,(uVar14 & 7) + 6,0,bhitm,bhito,obj,(boolean *)0x0);
        }
        else {
          iVar18 = (int)u.ux;
          iVar15 = (int)u.uy;
          yy = iVar15;
          xx = iVar18;
          ptVar10 = t_at(level,iVar18,iVar15);
          uVar8 = obj->otyp;
          bVar6 = true;
          bVar4 = false;
          bVar5 = false;
          if (uVar8 < 0x1c4) {
            if (uVar8 < 0x18c) {
              if (uVar8 == 0x186) {
LAB_00295098:
                bVar7 = is_db_wall(iVar18,iVar15);
                if ((bVar7 == '\0') || (bVar7 = find_drawbridge(&xx,&yy), bVar7 == '\0')) {
                  if (dz < '\x01') goto LAB_00294fb2;
                  if (x != (level->dnstair).sx) goto LAB_0029559b;
                  if ((((char)iVar15 == (level->dnstair).sy) &&
                      (bVar7 = on_level(&u.uz,&dungeon_topology.d_qstart_level), bVar7 != '\0')) &&
                     (bVar7 = ok_to_quest(), bVar7 == '\0')) {
                    pline("The stairs seem to ripple momentarily.");
                    bVar4 = true;
                  }
                  else {
                    bVar4 = false;
                  }
                  goto LAB_00295490;
                }
                open_drawbridge(xx,yy);
LAB_0029547a:
                bVar4 = true;
              }
              else if (uVar8 == 0x187) goto LAB_002952a4;
            }
            else {
              bVar4 = false;
              if (uVar8 == 0x18c) goto LAB_002952a9;
              bVar4 = bVar5;
              if (uVar8 == 0x1a4) {
                bVar7 = on_level(&u.uz,&dungeon_topology.d_air_level);
                if ((((bVar7 == '\0') &&
                     (bVar7 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar7 == '\0')) &&
                    ((u._1052_1_ & 2) == 0)) &&
                   ((bVar7 = on_level(&u.uz,&dungeon_topology.d_qstart_level), -1 < dz ||
                    (bVar7 == '\0')))) {
                  if (dz < '\0') {
                    pcVar17 = body_part(2);
                    bVar4 = false;
                    pline("Blood drips on your %s.",pcVar17);
                    goto switchD_002954fc_caseD_1a0;
                  }
                  if ((level->objects[u.ux][u.uy] == (obj *)0x0) &&
                     ((peVar11 = engr_at(level,u.ux,u.uy), peVar11 == (engr *)0x0 ||
                      (peVar11->engr_type != '\x02')))) {
                    bVar7 = is_pool(level,(int)u.ux,(int)u.uy);
                    if ((bVar7 == '\0') &&
                       (bVar7 = is_ice(level,(int)u.ux,(int)u.uy), bVar7 == '\0')) {
                      bVar7 = is_lava(level,(int)u.ux,(int)u.uy);
                      pcVar17 = "boil";
                      if (bVar7 == '\0') {
                        pcVar17 = "pool";
                      }
                      if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
                        pcVar12 = "at";
                        if ((youmonst.data)->mlet == '\x05') {
                          pcVar12 = "beneath";
                        }
                      }
                      else {
                        pcVar12 = "beneath";
                      }
                      pcVar13 = body_part(5);
                      pcVar13 = makeplural(pcVar13);
                      pline("Blood %ss %s your %s.",pcVar17,pcVar12,pcVar13);
                    }
                    else {
                      pline("Nothing happens.");
                    }
                  }
LAB_0029559b:
                  bVar4 = false;
                  goto LAB_00295490;
                }
                pline("Nothing happens.");
                bVar4 = false;
              }
            }
LAB_0029547d:
            if (dz < '\x01') goto switchD_002954fc_caseD_1a0;
          }
          else {
            if (uVar8 < 0x1cd) {
              if (uVar8 == 0x1c4) {
LAB_002952a4:
                bVar6 = false;
                bVar4 = true;
                goto LAB_002952a9;
              }
              bVar4 = bVar5;
              if (uVar8 == 0x1cc) goto LAB_00295098;
              goto LAB_0029547d;
            }
            if (uVar8 != 0x1cd) {
              bVar4 = bVar5;
              if (uVar8 == 0x1ce) {
                if (dz < '\0') {
                  pcVar17 = ceiling(iVar18,iVar15);
                  pline("You probe towards the %s.",pcVar17);
                }
                else {
                  iVar16 = bhitpile(obj,bhito,iVar18,iVar15);
                  pcVar17 = surface(iVar18,iVar15);
                  pline("You probe beneath the %s.",pcVar17);
                  iVar15 = display_binventory(iVar18,iVar15,'\x01');
                  bVar4 = true;
                  if (iVar15 + iVar16 != 0) goto switchD_002954fc_caseD_1a0;
                }
                pline("Your probe reveals nothing.");
                bVar4 = true;
                goto switchD_002954fc_caseD_1a0;
              }
              goto LAB_0029547d;
            }
LAB_002952a9:
            local_140 = ptVar10;
            if (level->locations[iVar18][iVar15].typ == '$') {
              iVar16 = iVar15;
              x_00 = iVar18;
              if ('\0' < dz) {
LAB_002952dc:
                if (bVar6) {
                  close_drawbridge(x_00,iVar16);
                }
                else {
                  destroy_drawbridge(x_00,iVar16);
                }
                goto LAB_0029547a;
              }
            }
            else {
              iVar16 = is_drawbridge_wall(iVar18,iVar15);
              if (((iVar16 != 0) && (bVar7 = is_db_wall(iVar18,iVar15), bVar7 == '\0')) &&
                 (bVar7 = find_drawbridge(&xx,&yy), iVar16 = yy, x_00 = xx, bVar7 != '\0'))
              goto LAB_002952dc;
            }
            if ((bVar4 && dz < '\0') && (uVar14 = mt_random(), 0x55555555 < uVar14 * -0x55555555)) {
              local_148 = &u.uz;
              bVar7 = on_level(&u.uz,&dungeon_topology.d_air_level);
              if ((bVar7 == '\0') &&
                 (((bVar7 = on_level(local_148,&dungeon_topology.d_water_level), bVar7 == '\0' &&
                   ((u._1052_1_ & 2) == 0)) &&
                  (bVar7 = on_level(local_148,&dungeon_topology.d_qstart_level), bVar7 == '\0')))) {
                iVar16 = iVar15;
                pcVar17 = ceiling(iVar18,iVar15);
                pcVar12 = body_part(8);
                pline("A rock is dislodged from the %s and falls on your %s.",pcVar17,pcVar12);
                uVar14 = 6;
                if ((uarmh != (obj *)0x0) &&
                   (uVar8 = *(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f, 10 < uVar8)) {
                  uVar14 = (uint)(0x11 < uVar8) * 4 + 2;
                }
                uVar9 = mt_random();
                losehp(uVar9 % uVar14 + 1,"falling rock",0);
                obj_00 = mksobj_at(0x213,level,iVar18,iVar15,'\0','\0');
                if (obj_00 != (obj *)0x0) {
                  xname(obj_00);
                  stackobj((obj *)CONCAT44(iVar16,in_stack_fffffffffffffe98));
                }
                newsym(iVar18,iVar15);
                bVar4 = false;
                goto switchD_002954fc_caseD_1a0;
              }
            }
            bVar4 = false;
            if (((!(bool)(bVar6 & local_140 != (trap *)0x0)) || (dz < '\x01')) ||
               ((local_140->field_0x8 & 0x1f) != 0xe)) goto LAB_0029547d;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002953e7;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002953e2;
LAB_00295652:
              if ((local_140->field_0x8 & 0x20) == 0) {
                bVar7 = is_ice(level,iVar18,iVar15);
                pcVar17 = "frost";
                if (bVar7 == '\0') {
                  pcVar17 = "dust";
                }
                bVar4 = false;
                pline("You see a swirl of %s beneath you.",pcVar17);
              }
              else {
                pline("A trap door beneath you closes up then vanishes.");
                bVar4 = true;
              }
            }
            else {
LAB_002953e2:
              if (ublindf != (obj *)0x0) {
LAB_002953e7:
                if (ublindf->oartifact == '\x1d') goto LAB_00295652;
              }
              bVar4 = false;
              You_hear("a twang followed by a thud.");
            }
            deltrap(level,local_140);
            newsym(iVar18,iVar15);
          }
LAB_00295490:
          bhitpile(obj,bhito,iVar18,iVar15);
          peVar11 = engr_at(level,x,(xchar)iVar15);
          plVar19 = level;
          if ((peVar11 != (engr *)0x0) && (peVar11->engr_type != '\x06')) {
            sVar3 = obj->otyp;
            switch(sVar3) {
            case 0x1c4:
switchD_0029555b_caseD_1c4:
              iVar18 = 2;
              iVar16 = -2;
              do {
                uVar14 = mt_random();
                iVar18 = iVar18 + (uVar14 & 3);
                cnt = (xchar)iVar18;
                iVar16 = iVar16 + 1;
              } while (iVar16 != 0);
LAB_0029588c:
              wipe_engr_at(plVar19,x,(xchar)iVar15,cnt);
              break;
            case 0x1c5:
            case 0x1ca:
switchD_002954fc_caseD_1a1:
              del_engr(level,peVar11);
              break;
            case 0x1c6:
            case 0x1c7:
            case 0x1c8:
              break;
            case 0x1c9:
switchD_002954fc_caseD_19e:
              del_engr(level,peVar11);
              plVar19 = level;
              pcVar17 = random_engraving(local_138);
              make_engr_at(plVar19,iVar18,iVar15,pcVar17,(ulong)moves,'\0');
              break;
            case 0x1cb:
switchD_002954fc_caseD_19f:
              rloc_engr(peVar11);
              break;
            default:
              switch(sVar3) {
              case 0x19e:
                goto switchD_002954fc_caseD_19e;
              case 0x19f:
                goto switchD_002954fc_caseD_19f;
              case 0x1a0:
              case 0x1a2:
              case 0x1a3:
                break;
              case 0x1a1:
                goto switchD_002954fc_caseD_1a1;
              case 0x1a4:
                if (peVar11->engr_type == '\x02') {
                  pcVar17 = "The edges on the floor get smoother.";
                  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                    if (u.umonnum == u.umonster) {
                      pcVar17 = "The floor runs like butter!";
                    }
                    else {
                      bVar7 = dmgtype(youmonst.data,0x24);
                      pcVar17 = "The edges on the floor get smoother.";
                      if (bVar7 == '\0') {
                        pcVar17 = "The floor runs like butter!";
                      }
                    }
                  }
                  pline(pcVar17);
                  plVar19 = level;
                  iVar18 = 2;
                  iVar16 = -2;
                  do {
                    uVar14 = mt_random();
                    iVar18 = iVar18 + (uVar14 & 3);
                    cnt = (xchar)iVar18;
                    iVar16 = iVar16 + 1;
                  } while (iVar16 != 0);
                  goto LAB_0029588c;
                }
                break;
              default:
                if (sVar3 == 0x187) goto switchD_0029555b_caseD_1c4;
              }
            }
          }
        }
      }
      else {
        bhitm(u.ustuck,obj);
LAB_00294fb2:
        bVar4 = false;
      }
switchD_002954fc_caseD_1a0:
      if (obj_zapped == '\x01') {
        pline("You feel shuddering vibrations.");
      }
      goto LAB_0029515f;
    }
    iVar15 = (int)sVar2;
    if ((iVar15 == 0x1cf) || (sVar2 == 0x17d)) {
      zap_dig(dx,dy,dz);
    }
    else {
      if ((ushort)(sVar2 - 0x17eU) < 5) {
        iVar18 = iVar15 + -0x174;
        iVar15 = u.ulevel / 2 + 1;
      }
      else {
        iVar18 = sVar2 + -0x1d0;
        if (5 < (ushort)iVar18) {
          warning("weffects: unexpected spell or wand");
          goto LAB_0029515c;
        }
        iVar15 = (uint)(iVar15 != 0x1d0) * 4 + 2;
      }
      buzz(iVar18,iVar15,u.ux,u.uy,(int)dx,(int)dy);
    }
  }
  else {
    uVar14 = (ushort)obj->otyp - 0x185;
    if (0x1c < uVar14) {
LAB_00294e6c:
      uVar14 = (ushort)obj->otyp - 0x1c4;
      if (uVar14 < 0xb) {
        if ((0x16fU >> (uVar14 & 0x1f) & 1) != 0) goto LAB_00294e81;
        if (uVar14 == 7) goto LAB_002950d5;
        if (uVar14 != 10) goto LAB_00294ebf;
        probe_monster(u.usteed);
        discover_object(0x1ce,'\x01','\x01');
LAB_00294e89:
        bVar4 = true;
        goto LAB_0029515f;
      }
      goto LAB_00294ebf;
    }
    if ((0x12021067U >> (uVar14 & 0x1f) & 1) != 0) {
LAB_00294e81:
      bhitm(u.usteed,obj);
      goto LAB_00294e89;
    }
    if (uVar14 != 0x1a) goto LAB_00294e6c;
LAB_002950d5:
    tele((char *)0x0);
    if (((u.uprops[0xf].extrinsic == 0 && u.uprops[0xf].intrinsic == 0) &&
        (((youmonst.data)->mflags1 & 0x4000000) == 0)) && ((viz_array[u.uy0][u.ux0] & 1U) != 0)) {
      iVar15 = dist2((int)u.ux0,(int)u.uy0,(int)u.ux,(int)u.uy);
      bVar4 = true;
      if (iVar15 < 0x10) goto LAB_0029515f;
    }
    discover_object((int)obj->otyp,'\x01','\x01');
  }
LAB_0029515c:
  bVar4 = true;
LAB_0029515f:
  if ((bVar4) && ((bVar1 & 1) == 0)) {
    discover_object((int)sVar2,'\x01','\x01');
    more_experienced(0,0,10);
  }
  return;
}

Assistant:

void weffects(struct obj *obj, schar dx, schar dy, schar dz)
{
	int otyp = obj->otyp;
	boolean disclose = FALSE, was_unkn = !objects[otyp].oc_name_known;

	exercise(A_WIS, TRUE);
	if (u.usteed && (objects[otyp].oc_dir != NODIR) &&
	    !dx && !dy && (dz > 0) && zap_steed(obj)) {
		disclose = TRUE;
	} else if (objects[otyp].oc_dir == IMMEDIATE) {
	    obj_zapped = FALSE;

	    if (u.uswallow) {
		bhitm(u.ustuck, obj);
		/* [how about `bhitpile(u.ustuck->minvent)' effect?] */
	    } else if (dz) {
		disclose = zap_updown(obj, dz);
	    } else {
		beam_hit(dx, dy, rn1(8,6), ZAPPED_WAND, bhitm, bhito, obj, NULL);
	    }
	    /* give a clue if obj_zapped */
	    if (obj_zapped)
		pline("You feel shuddering vibrations.");

	} else if (objects[otyp].oc_dir == NODIR) {
	    zapnodir(obj);

	} else {
	    /* neither immediate nor directionless */

	    if (otyp == WAN_DIGGING || otyp == SPE_DIG)
		zap_dig(dx, dy, dz);
	    else if (otyp >= SPE_MAGIC_MISSILE && otyp <= SPE_FINGER_OF_DEATH)
		buzz(otyp - SPE_MAGIC_MISSILE + 10,
		     u.ulevel / 2 + 1,
		     u.ux, u.uy, dx, dy);
	    else if (otyp >= WAN_MAGIC_MISSILE && otyp <= WAN_LIGHTNING)
		buzz(otyp - WAN_MAGIC_MISSILE,
		     (otyp == WAN_MAGIC_MISSILE) ? 2 : 6,
		     u.ux, u.uy, dx, dy);
	    else
		warning("weffects: unexpected spell or wand");
	    disclose = TRUE;
	}
	if (disclose && was_unkn) {
	    makeknown(otyp);
	    more_experienced(0, 0, 10);
	}
	return;
}